

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc.h
# Opt level: O2

void __thiscall embree::FastAllocator::reset(FastAllocator *this)

{
  __pointer_type pBVar1;
  ulong uVar2;
  pointer ppTVar3;
  Block *pBVar4;
  long lVar5;
  ulong uVar6;
  pointer ppTVar7;
  
  internal_fix_used_blocks(this);
  LOCK();
  (this->bytesUsed).super___atomic_base<unsigned_long>._M_i = 0;
  UNLOCK();
  LOCK();
  (this->bytesFree).super___atomic_base<unsigned_long>._M_i = 0;
  UNLOCK();
  LOCK();
  (this->bytesWasted).super___atomic_base<unsigned_long>._M_i = 0;
  UNLOCK();
  while ((this->usedBlocks)._M_b._M_p != (__pointer_type)0x0) {
    pBVar1 = (this->usedBlocks)._M_b._M_p;
    uVar2 = (pBVar1->allocEnd).super___atomic_base<unsigned_long>._M_i;
    uVar6 = (pBVar1->cur).super___atomic_base<unsigned_long>._M_i;
    if (uVar6 < uVar2) {
      uVar6 = uVar2;
    }
    LOCK();
    (pBVar1->allocEnd).super___atomic_base<unsigned_long>._M_i = uVar6;
    UNLOCK();
    LOCK();
    (pBVar1->cur).super___atomic_base<unsigned_long>._M_i = 0;
    UNLOCK();
    pBVar4 = ((this->usedBlocks)._M_b._M_p)->next;
    ((this->usedBlocks)._M_b._M_p)->next = (this->freeBlocks)._M_b._M_p;
    LOCK();
    (this->freeBlocks)._M_b._M_p = (this->usedBlocks)._M_b._M_p;
    UNLOCK();
    LOCK();
    (this->usedBlocks)._M_b._M_p = pBVar4;
    UNLOCK();
  }
  pBVar4 = Block::remove_shared_blocks((this->freeBlocks)._M_b._M_p);
  LOCK();
  (this->freeBlocks)._M_b._M_p = pBVar4;
  UNLOCK();
  for (lVar5 = 0x17; lVar5 != 0x1f; lVar5 = lVar5 + 1) {
    LOCK();
    *(undefined8 *)((long)this + lVar5 * 8 + -0x40) = 0;
    UNLOCK();
    LOCK();
    this->threadUsedBlocks[lVar5 + -0xf]._M_b._M_p = (__pointer_type)0x0;
    UNLOCK();
  }
  ppTVar3 = (this->thread_local_allocators).
            super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppTVar7 = (this->thread_local_allocators).
                 super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppTVar7 != ppTVar3;
      ppTVar7 = ppTVar7 + 1) {
    ThreadLocal2::unbind(*ppTVar7,this);
  }
  ppTVar7 = (this->thread_local_allocators).
            super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->thread_local_allocators).
      super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppTVar7) {
    (this->thread_local_allocators).
    super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppTVar7;
  }
  return;
}

Assistant:

void reset ()
    {
      internal_fix_used_blocks();

      bytesUsed.store(0);
      bytesFree.store(0);
      bytesWasted.store(0);

      /* reset all used blocks and move them to begin of free block list */
      while (usedBlocks.load() != nullptr) {
        usedBlocks.load()->reset_block();
        Block* nextUsedBlock = usedBlocks.load()->next;
        usedBlocks.load()->next = freeBlocks.load();
        freeBlocks = usedBlocks.load();
        usedBlocks = nextUsedBlock;
      }

      /* remove all shared blocks as they are re-added during build */
      freeBlocks.store(Block::remove_shared_blocks(freeBlocks.load()));

      for (size_t i=0; i<MAX_THREAD_USED_BLOCK_SLOTS; i++)
      {
        threadUsedBlocks[i] = nullptr;
        threadBlocks[i] = nullptr;
      }
      
      /* unbind all thread local allocators */
      for (auto alloc : thread_local_allocators) alloc->unbind(this);
      thread_local_allocators.clear();
    }